

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscStatements.cpp
# Opt level: O0

Statement *
slang::ast::ProceduralAssignStatement::fromSyntax
          (Compilation *compilation,ProceduralAssignStatementSyntax *syntax,ASTContext *context)

{
  SourceRange sourceRange;
  bool bVar1;
  int iVar2;
  ExpressionSyntax *pEVar3;
  undefined4 extraout_var;
  Expression *pEVar4;
  AssignmentExpression *this;
  Expression *pEVar5;
  sockaddr *in_RDX;
  long in_RSI;
  Compilation *in_RDI;
  SourceRange SVar6;
  Expression *lval;
  ProceduralAssignStatement *result;
  Expression *assign;
  bitmask<slang::ast::ASTFlags> astFlags;
  bool isForce;
  Statement *in_stack_ffffffffffffff48;
  ASTFlags in_stack_ffffffffffffff50;
  ASTFlags in_stack_ffffffffffffff58;
  bool *in_stack_ffffffffffffff60;
  ASTContext *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  SourceLocation in_stack_ffffffffffffff78;
  undefined8 in_stack_ffffffffffffff80;
  DiagCode code;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  SyntaxNode *in_stack_ffffffffffffff98;
  unkbyte9 Var7;
  bitmask<slang::ast::ASTFlags> local_40;
  bitmask<slang::ast::ASTFlags> local_38;
  bitmask<slang::ast::ASTFlags> local_30;
  byte local_21;
  sockaddr *local_20;
  Compilation *local_10;
  Expression *local_8;
  
  code = SUB84((ulong)in_stack_ffffffffffffff80 >> 0x20,0);
  local_21 = *(short *)(in_RSI + 0x58) == 0xab;
  local_20 = in_RDX;
  local_10 = in_RDI;
  local_30 = ast::operator|(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  if ((local_21 & 1) == 0) {
    bitmask<slang::ast::ASTFlags>::bitmask(&local_40,ProceduralAssign);
    bitmask<slang::ast::ASTFlags>::operator|=(&local_30,&local_40);
  }
  else {
    bitmask<slang::ast::ASTFlags>::bitmask(&local_38,ProceduralForceRelease);
    bitmask<slang::ast::ASTFlags>::operator|=(&local_30,&local_38);
  }
  pEVar3 = not_null<slang::syntax::ExpressionSyntax_*>::operator*
                     ((not_null<slang::syntax::ExpressionSyntax_*> *)0xc0b525);
  iVar2 = Expression::bind((int)pEVar3,local_20,(socklen_t)local_30.m_bits);
  pEVar5 = (Expression *)CONCAT44(extraout_var,iVar2);
  pEVar4 = pEVar5;
  SVar6 = slang::syntax::SyntaxNode::sourceRange(in_stack_ffffffffffffff98);
  Var7 = SVar6._7_9_;
  pEVar4 = (Expression *)
           BumpAllocator::
           emplace<slang::ast::ProceduralAssignStatement,slang::ast::Expression_const&,bool&,slang::SourceRange>
                     ((BumpAllocator *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70)
                      ,(Expression *)in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
                      (SourceRange *)pEVar4);
  bVar1 = Expression::bad((Expression *)local_10);
  if (bVar1) {
    local_8 = (Expression *)Statement::badStmt(local_10,in_stack_ffffffffffffff48);
  }
  else {
    local_8 = pEVar4;
    if (pEVar5->kind == Assignment) {
      this = Expression::as<slang::ast::AssignmentExpression>(pEVar5);
      pEVar5 = AssignmentExpression::left(this);
      if ((local_21 & 1) == 0) {
        bVar1 = isValidAssignLVal((Expression *)
                                  CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
        local_8 = pEVar4;
        if (!bVar1) {
          SVar6.startLoc._4_4_ = 0x40008;
          SVar6.startLoc._0_4_ = in_stack_ffffffffffffff70;
          SVar6.endLoc = in_stack_ffffffffffffff78;
          ASTContext::addDiag((ASTContext *)(pEVar5->sourceRange).endLoc,code,SVar6);
          local_8 = (Expression *)Statement::badStmt(local_10,in_stack_ffffffffffffff48);
        }
      }
      else {
        bVar1 = isValidForceLVal(pEVar4,(ASTContext *)((unkuint9)Var7 >> 8),SUB91(Var7,0));
        local_8 = pEVar4;
        if (!bVar1) {
          sourceRange.startLoc._4_4_ = in_stack_ffffffffffffff74;
          sourceRange.startLoc._0_4_ = in_stack_ffffffffffffff70;
          sourceRange.endLoc = (pEVar5->sourceRange).startLoc;
          ASTContext::addDiag(in_stack_ffffffffffffff68,SUB84((pEVar5->sourceRange).endLoc,4),
                              sourceRange);
          local_8 = (Expression *)Statement::badStmt(local_10,in_stack_ffffffffffffff48);
        }
      }
    }
  }
  return (Statement *)local_8;
}

Assistant:

Statement& ProceduralAssignStatement::fromSyntax(Compilation& compilation,
                                                 const ProceduralAssignStatementSyntax& syntax,
                                                 const ASTContext& context) {
    bool isForce = syntax.keyword.kind == TokenKind::ForceKeyword;
    bitmask<ASTFlags> astFlags = ASTFlags::NonProcedural | ASTFlags::AssignmentAllowed;
    if (isForce)
        astFlags |= ASTFlags::ProceduralForceRelease;
    else
        astFlags |= ASTFlags::ProceduralAssign;

    auto& assign = Expression::bind(*syntax.expr, context, astFlags);
    auto result = compilation.emplace<ProceduralAssignStatement>(assign, isForce,
                                                                 syntax.sourceRange());
    if (assign.bad())
        return badStmt(compilation, result);

    if (assign.kind == ExpressionKind::Assignment) {
        auto& lval = assign.as<AssignmentExpression>().left();
        if (isForce) {
            if (!isValidForceLVal(lval, context, false)) {
                context.addDiag(diag::BadProceduralForce, lval.sourceRange);
                return badStmt(compilation, result);
            }
        }
        else {
            if (!isValidAssignLVal(lval)) {
                context.addDiag(diag::BadProceduralAssign, lval.sourceRange);
                return badStmt(compilation, result);
            }
        }
    }

    return *result;
}